

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O0

int concat_Properties(STRING_HANDLE existing,MAP_HANDLE map,
                     size_t *propertiesMessageSizeContribution)

{
  MAP_RESULT MVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  size_t sVar5;
  LOGGER_LOG local_60;
  size_t i;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t count;
  char **values;
  char **keys;
  size_t *psStack_20;
  int result;
  size_t *propertiesMessageSizeContribution_local;
  MAP_HANDLE map_local;
  STRING_HANDLE existing_local;
  
  psStack_20 = propertiesMessageSizeContribution;
  propertiesMessageSizeContribution_local = (size_t *)map;
  map_local = (MAP_HANDLE)existing;
  MVar1 = Map_GetInternals(map,&values,(char ***)&count,(size_t *)&l);
  if (MVar1 == MAP_OK) {
    if (l == (LOGGER_LOG)0x0) {
      keys._4_4_ = 0;
      *psStack_20 = 0;
    }
    else {
      iVar2 = STRING_concat((STRING_HANDLE)map_local,",\"properties\":");
      if (iVar2 == 0) {
        iVar2 = appendMapToJSON((STRING_HANDLE)map_local,values,(char **)count,(size_t)l);
        if (iVar2 == 0) {
          *psStack_20 = 0;
          for (local_60 = (LOGGER_LOG)0x0; local_60 < l; local_60 = local_60 + 1) {
            sVar4 = strlen(values[(long)local_60]);
            sVar5 = strlen(*(char **)(count + (long)local_60 * 8));
            *psStack_20 = sVar4 + sVar5 + 0x10 + *psStack_20;
          }
          keys._4_4_ = 0;
        }
        else {
          keys._4_4_ = 0x49e;
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                      ,"concat_Properties",0x49f,1,"unable to append the properties");
          }
        }
      }
      else {
        keys._4_4_ = 0x499;
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                    ,"concat_Properties",0x49a,1,"failed STRING_concat");
        }
      }
    }
  }
  else {
    keys._4_4_ = 0x488;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"concat_Properties",0x489,1,"error while Map_GetInternals");
    }
  }
  return keys._4_4_;
}

Assistant:

static int concat_Properties(STRING_HANDLE existing, MAP_HANDLE map, size_t* propertiesMessageSizeContribution)
{
    int result;
    const char*const* keys;
    const char*const* values;
    size_t count;
    if (Map_GetInternals(map, &keys, &values, &count) != MAP_OK)
    {
        result = MU_FAILURE;
        LogError("error while Map_GetInternals");
    }
    else
    {

        if (count == 0)
        {
            /*no properties - do nothing with existing*/
            result = 0;
            *propertiesMessageSizeContribution = 0;
        }
        else
        {
            if (STRING_concat(existing, ",\"properties\":") != 0)
            {
                /*go ahead and return it*/
                result = MU_FAILURE;
                LogError("failed STRING_concat");
            }
            else if (appendMapToJSON(existing, keys, values, count) != 0)
            {
                result = MU_FAILURE;
                LogError("unable to append the properties");
            }
            else
            {
                /*all is fine*/
                size_t i;
                *propertiesMessageSizeContribution = 0;
                for (i = 0; i < count; i++)
                {
                    *propertiesMessageSizeContribution += (strlen(keys[i]) + strlen(values[i]) + MAXIMUM_PROPERTY_OVERHEAD);
                }
                result = 0;
            }
        }
    }
    return result;
}